

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O2

char * CP_GetContactString(SstStream Stream,attr_list DPAttrs)

{
  atom_t aVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uVar5;
  SstParams p_Var6;
  
  uVar3 = create_attr_list();
  aVar1 = CM_TRANSPORT_ATOM;
  pcVar4 = strdup(Stream->ConfigParams->ControlTransport);
  set_string_attr(uVar3,aVar1,pcVar4);
  if (Stream->ConfigParams->ControlInterface == (char *)0x0) {
    pcVar4 = Stream->ConfigParams->NetworkInterface;
    aVar1 = IP_INTERFACE_ATOM;
    if (pcVar4 == (char *)0x0) goto LAB_00117804;
  }
  else {
    aVar1 = attr_atom_from_string("IP_INTERFACE");
    pcVar4 = Stream->ConfigParams->ControlInterface;
  }
  pcVar4 = strdup(pcVar4);
  set_string_attr(uVar3,aVar1,pcVar4);
LAB_00117804:
  uVar5 = CMget_specific_contact_list(Stream->CPInfo->SharedCM->cm,uVar3);
  uVar5 = CMderef_and_copy_list(Stream->CPInfo->SharedCM->cm,uVar5);
  p_Var6 = Stream->ConfigParams;
  iVar2 = strcmp(p_Var6->ControlTransport,"enet");
  if (iVar2 == 0) {
    set_int_attr(uVar5,CM_ENET_CONN_TIMEOUT,60000);
    p_Var6 = Stream->ConfigParams;
  }
  aVar1 = SST_GROUP_ID_ATOM;
  if (p_Var6->RemoteGroup != (char *)0x0) {
    pcVar4 = strdup(p_Var6->RemoteGroup);
    set_string_attr(uVar5,aVar1,pcVar4);
  }
  if (DPAttrs != (attr_list)0x0) {
    attr_merge_lists(uVar5,DPAttrs);
  }
  pcVar4 = (char *)attr_list_to_string(uVar5);
  free_attr_list(uVar3);
  free_attr_list(uVar5);
  return pcVar4;
}

Assistant:

extern char *CP_GetContactString(SstStream Stream, attr_list DPAttrs)
{
    attr_list ListenList = create_attr_list(), ContactList;
    set_string_attr(ListenList, CM_TRANSPORT_ATOM, strdup(Stream->ConfigParams->ControlTransport));
    if (Stream->ConfigParams->ControlInterface)
    {
        set_string_attr(ListenList, attr_atom_from_string("IP_INTERFACE"),
                        strdup(Stream->ConfigParams->ControlInterface));
    }
    else if (Stream->ConfigParams->NetworkInterface)
    {
        set_string_attr(ListenList, IP_INTERFACE_ATOM,
                        strdup(Stream->ConfigParams->NetworkInterface));
    }
    ContactList = CMget_specific_contact_list(Stream->CPInfo->SharedCM->cm, ListenList);
    ContactList = CMderef_and_copy_list(Stream->CPInfo->SharedCM->cm, ContactList);
    if (strcmp(Stream->ConfigParams->ControlTransport, "enet") == 0)
    {
        set_int_attr(ContactList, CM_ENET_CONN_TIMEOUT, 60000); /* 60 seconds */
    }
    if (Stream->ConfigParams->RemoteGroup)
    {
        set_string_attr(ContactList, SST_GROUP_ID_ATOM, strdup(Stream->ConfigParams->RemoteGroup));
    }
    if (DPAttrs)
    {
        attr_merge_lists(ContactList, DPAttrs);
    }
    char *ret = attr_list_to_string(ContactList);
    free_attr_list(ListenList);
    free_attr_list(ContactList);
    return ret;
}